

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O2

void __thiscall MIDIStreamer::Play(MIDIStreamer *this,bool looping,int subsong)

{
  char *filename;
  EMidiDevice devtype;
  int iVar1;
  uint uVar2;
  TimidityWaveWriterMIDIDevice *this_00;
  MIDIDevice *pMVar3;
  
  (this->super_MusInfo).m_Status = STATE_Stopped;
  (this->super_MusInfo).m_Looping = looping;
  this->EndQueued = 0;
  this->VolumeChanged = false;
  this->Restarting = true;
  this->InitialPlayback = true;
  if (this->MIDI != (MIDIDevice *)0x0) {
    __assert_fail("MIDI == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_midistream.cpp"
                  ,0x142,"virtual void MIDIStreamer::Play(bool, int)");
  }
  devtype = SelectMIDIDevice(this->DeviceType);
  filename = (this->DumpFilename).Chars;
  if (*(int *)(filename + -0xc) == 0) {
    this_00 = (TimidityWaveWriterMIDIDevice *)CreateMIDIDevice(this,devtype);
    this->MIDI = (MIDIDevice *)this_00;
    if (this_00 == (TimidityWaveWriterMIDIDevice *)0x0) goto LAB_0035b42d;
  }
  else {
    if (devtype == MDEV_GUS) {
      this_00 = (TimidityWaveWriterMIDIDevice *)operator_new(0x70);
      TimidityWaveWriterMIDIDevice::TimidityWaveWriterMIDIDevice(this_00,filename,0);
    }
    else {
      if (devtype != MDEV_OPL) goto LAB_0035b42d;
      this_00 = (TimidityWaveWriterMIDIDevice *)operator_new(0xcf8);
      OPLDumperMIDIDevice::OPLDumperMIDIDevice((OPLDumperMIDIDevice *)this_00,filename);
    }
    this->MIDI = (MIDIDevice *)this_00;
  }
  iVar1 = (*(((OPLMIDIDevice *)&this_00->super_TimidityMIDIDevice)->super_SoftSynthMIDIDevice).
            super_MIDIDevice._vptr_MIDIDevice[0x10])(this_00);
  if ((char)iVar1 != '\0') {
    __assert_fail("MIDI == NULL || MIDI->NeedThreadedCallback() == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sound/music_midistream.cpp"
                  ,0x155,"virtual void MIDIStreamer::Play(bool, int)");
  }
  pMVar3 = this->MIDI;
  if ((pMVar3 != (MIDIDevice *)0x0) &&
     (iVar1 = (*pMVar3->_vptr_MIDIDevice[2])(pMVar3,Callback,this), iVar1 == 0)) {
    (*(this->super_MusInfo)._vptr_MusInfo[0x1b])(this,(ulong)(uint)subsong);
    uVar2 = (*this->MIDI->_vptr_MIDIDevice[5])();
    (*(this->super_MusInfo)._vptr_MusInfo[0x16])(this,(ulong)uVar2);
    iVar1 = (*this->MIDI->_vptr_MIDIDevice[0x17])(this->MIDI,this,(ulong)looping);
    if ((char)iVar1 == '\0') {
      pMVar3 = this->MIDI;
    }
    else {
      (*(this->super_MusInfo)._vptr_MusInfo[0x15])(this);
      pMVar3 = this->MIDI;
      if (pMVar3 == (MIDIDevice *)0x0) {
        return;
      }
    }
    iVar1 = (*pMVar3->_vptr_MIDIDevice[10])();
    if (iVar1 == 0) {
      (this->super_MusInfo).m_Status = STATE_Playing;
      return;
    }
    Printf("Starting MIDI playback failed\n");
    (*(this->super_MusInfo)._vptr_MusInfo[7])(this);
    return;
  }
LAB_0035b42d:
  Printf(200,"Could not open MIDI out device\n");
  if (this->MIDI != (MIDIDevice *)0x0) {
    (*this->MIDI->_vptr_MIDIDevice[1])();
    this->MIDI = (MIDIDevice *)0x0;
  }
  return;
}

Assistant:

void MIDIStreamer::Play(bool looping, int subsong)
{
	DWORD tid;
	EMidiDevice devtype;

	m_Status = STATE_Stopped;
	m_Looping = looping;
	EndQueued = 0;
	VolumeChanged = false;
	Restarting = true;
	InitialPlayback = true;

	assert(MIDI == NULL);
	devtype = SelectMIDIDevice(DeviceType);
	if (DumpFilename.IsNotEmpty())
	{
		if (devtype == MDEV_OPL)
		{
			MIDI = new OPLDumperMIDIDevice(DumpFilename);
		}
		else if (devtype == MDEV_GUS)
		{
			MIDI = new TimidityWaveWriterMIDIDevice(DumpFilename, 0);
		}
	}
	else
	{
		MIDI = CreateMIDIDevice(devtype);
	}
	
#ifndef _WIN32
	assert(MIDI == NULL || MIDI->NeedThreadedCallback() == false);
#endif

	if (MIDI == NULL || 0 != MIDI->Open(Callback, this))
	{
		Printf(PRINT_BOLD, "Could not open MIDI out device\n");
		if (MIDI != NULL)
		{
			delete MIDI;
			MIDI = NULL;
		}
		return;
	}

	SetMIDISubsong(subsong);
	CheckCaps(MIDI->GetTechnology());

	if (MIDI->Preprocess(this, looping))
	{
		StartPlayback();
		if (MIDI == NULL)
		{ // The MIDI file had no content and has been automatically closed.
			return;
		}
	}

	if (0 != MIDI->Resume())
	{
		Printf ("Starting MIDI playback failed\n");
		Stop();
	}
	else
	{
#ifdef _WIN32
		if (MIDI->NeedThreadedCallback())
		{
			PlayerThread = CreateThread(NULL, 0, PlayerProc, this, 0, &tid);
			if (PlayerThread == NULL)
			{
				Printf ("Creating MIDI thread failed\n");
				Stop();
			}
			else
			{
				m_Status = STATE_Playing;
			}
		}
		else
#endif
		{
			m_Status = STATE_Playing;
		}
	}
}